

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-trust-schema-pattern.c
# Opt level: O3

int ndn_trust_schema_pattern_from_string
              (ndn_trust_schema_pattern_t *pattern,char *string,uint32_t size)

{
  ndn_trust_schema_pattern_component_t *pnVar1;
  byte bVar2;
  uint8_t *puVar3;
  uint8_t uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  byte bVar8;
  ulong uVar9;
  int __length;
  ulong uVar10;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  re_registers *__regs;
  re_registers *__regs_00;
  ulong uVar14;
  byte *__string;
  undefined1 auStack_8c [8];
  ndn_trust_schema_pattern_component_t component;
  uint local_38;
  
  uVar10 = (ulong)size;
  if (size == 0) {
    return -0x9c;
  }
  if (string[size - 1] == '\0') {
    size = size - 1;
  }
  uVar14 = (ulong)size;
  if (size - 1 != 0) {
    uVar9 = 0;
    do {
      if (string[uVar9] == '\0') {
        return -0x9d;
      }
      uVar9 = uVar9 + 1;
    } while (size - 1 != uVar9);
  }
  pattern->components_size = 0;
  if (((byte)*string - 0x28 < 0x35) &&
     (uVar9 = 0x18000000100001,
     (0x18000000100001U >> ((ulong)((byte)*string - 0x28) & 0x3f) & 1) != 0)) {
    bVar12 = 0;
    if (size == 0) {
      uVar4 = '\0';
      bVar8 = 0;
    }
    else {
      uVar4 = '\0';
      local_38 = 0;
      bVar8 = 0;
      __regs_00 = (re_registers *)0x0;
      __string = (byte *)string;
      component._52_8_ = uVar14;
      bVar13 = 0;
      do {
        bVar2 = *__string;
        iVar7 = (int)uVar9;
        iVar6 = (int)uVar10;
        if (bVar2 < 0x3c) {
          if (bVar2 == 0) {
            iVar6 = -1;
            bVar11 = bVar12;
LAB_00112d98:
            if (bVar13 == 1 && bVar11 == 1) {
              return -0x9f;
            }
            goto LAB_00112e57;
          }
          bVar11 = bVar13;
          if (bVar2 == 0x28) {
            iVar7 = re_match((re_pattern_buffer *)")",(char *)__string,iVar6,iVar7,__regs_00);
            if (iVar7 == -1) {
              return -0x9e;
            }
            __string = __string + 1;
            __regs_00 = (re_registers *)CONCAT71((int7)((ulong)__regs_00 >> 8),1);
            uVar10 = extraout_RDX;
          }
          else {
            if (bVar2 != 0x29) {
              return -0x9e;
            }
            uVar5 = pattern->components_size - 1;
            uVar9 = CONCAT71((int7)(uVar9 >> 8),
                             pattern->components[uVar5].subpattern_info | (byte)local_38) | 0x40;
            pattern->components[uVar5].subpattern_info = (uint8_t)uVar9;
            local_38 = (uint)(byte)((byte)local_38 + 1);
            uVar10 = (ulong)local_38;
            __string = __string + 1;
          }
        }
        else {
          if (bVar2 == 0x5c) {
            iVar6 = re_match((re_pattern_buffer *)"[0-9]",(char *)__string,iVar6,iVar7,__regs_00);
            if (iVar6 == -1) {
              return -0x9e;
            }
            uVar4 = uVar4 + '\x01';
            bVar11 = 4;
          }
          else if (bVar2 == 0x5b) {
            iVar6 = re_match((re_pattern_buffer *)0x1202c2,(char *)__string,iVar6,iVar7,__regs_00);
            if (iVar6 == -1) {
              return -0x9e;
            }
            bVar11 = 5;
          }
          else {
            if (bVar2 != 0x3c) {
              return -0x9e;
            }
            __regs = __regs_00;
            iVar6 = re_match((re_pattern_buffer *)"^<>\\*",(char *)__string,iVar6,iVar7,__regs_00);
            if (iVar6 != -1) {
              iVar6 = iVar6 + 2;
              bVar11 = 1;
              goto LAB_00112d98;
            }
            iVar6 = re_match((re_pattern_buffer *)0x11fed0,(char *)__string,__length,iVar7,__regs);
            if (iVar6 == -1) {
              return -0x9e;
            }
            bVar11 = iVar6 == 2 ^ 3;
          }
LAB_00112e57:
          component.value[0x2a] = '\0';
          iVar7 = ndn_trust_schema_pattern_component_from_string
                            ((ndn_trust_schema_pattern_component_t *)auStack_8c,(char *)__string,
                             iVar6 + 1U);
          if (iVar7 != 0) {
            return iVar7;
          }
          if (((ulong)__regs_00 & 1) != 0) {
            component.value[0x2a] = component.value[0x2a] | bVar8 | 0x80;
            bVar8 = bVar8 + 1;
            if (4 < bVar8) {
              return -0xa0;
            }
          }
          uVar5 = pattern->components_size;
          uVar9 = (ulong)(uVar5 + 1);
          if (10 < uVar5 + 1) {
            return -10;
          }
          puVar3 = pattern->components[uVar5].value;
          *(ulong *)(puVar3 + 0x28) = CONCAT44(component.value._36_4_,component.value._32_4_);
          *(ulong *)(puVar3 + 0x30) =
               CONCAT53(component.value._43_5_,
                        CONCAT12(component.value[0x2a],component.value._40_2_));
          puVar3 = pattern->components[uVar5].value + 0x1c;
          *(undefined8 *)puVar3 = component.value._20_8_;
          *(ulong *)(puVar3 + 8) = CONCAT44(component.value._32_4_,component.value._28_4_);
          puVar3 = pattern->components[uVar5].value + 0xc;
          *(undefined8 *)puVar3 = component.value._4_8_;
          *(undefined8 *)(puVar3 + 8) = component.value._12_8_;
          pnVar1 = pattern->components + uVar5;
          pnVar1->type = auStack_8c._0_4_;
          pnVar1->value[0] = auStack_8c[4];
          pnVar1->value[1] = auStack_8c[5];
          pnVar1->value[2] = auStack_8c[6];
          pnVar1->value[3] = auStack_8c[7];
          *(undefined8 *)(pnVar1->value + 4) = component._0_8_;
          pattern->components_size = pattern->components_size + 1;
          __string = __string + (int)(iVar6 + 1U);
          __regs_00 = (re_registers *)0x0;
          uVar10 = extraout_RDX_00;
          uVar14 = component._52_8_;
          bVar12 = bVar11;
        }
        bVar13 = bVar11;
      } while ((uint)((int)__string - (int)string) < (uint)uVar14);
      if (bVar8 != (byte)local_38) {
        return -0x9e;
      }
    }
    pattern->num_subpattern_captures = bVar8;
    pattern->num_subpattern_indexes = uVar4;
  }
  else {
    iVar7 = ndn_trust_schema_pattern_component_from_string
                      ((ndn_trust_schema_pattern_component_t *)auStack_8c,string,size);
    if (iVar7 != 0) {
      return iVar7;
    }
    uVar5 = pattern->components_size;
    if (10 < uVar5 + 1) {
      return -10;
    }
    puVar3 = pattern->components[uVar5].value;
    *(ulong *)(puVar3 + 0x28) = CONCAT44(component.value._36_4_,component.value._32_4_);
    *(ulong *)(puVar3 + 0x30) =
         CONCAT53(component.value._43_5_,CONCAT12(component.value[0x2a],component.value._40_2_));
    puVar3 = pattern->components[uVar5].value + 0x1c;
    *(undefined8 *)puVar3 = component.value._20_8_;
    *(ulong *)(puVar3 + 8) = CONCAT44(component.value._32_4_,component.value._28_4_);
    puVar3 = pattern->components[uVar5].value + 0xc;
    *(undefined8 *)puVar3 = component.value._4_8_;
    *(undefined8 *)(puVar3 + 8) = component.value._12_8_;
    pnVar1 = pattern->components + uVar5;
    pnVar1->type = auStack_8c._0_4_;
    pnVar1->value[0] = auStack_8c[4];
    pnVar1->value[1] = auStack_8c[5];
    pnVar1->value[2] = auStack_8c[6];
    pnVar1->value[3] = auStack_8c[7];
    *(undefined8 *)(pnVar1->value + 4) = component._0_8_;
    pattern->components_size = pattern->components_size + 1;
  }
  return 0;
}

Assistant:

int
ndn_trust_schema_pattern_from_string(ndn_trust_schema_pattern_t* pattern,
                                     const char* string, uint32_t size)
{
  if (size == 0) return NDN_TRUST_SCHEMA_PATTERN_STRING_ZERO_LENGTH;

  if (string[size - 1] == '\0') size--;

  for (uint32_t i = 0; i < size - 1; i++) {
    if (string[i] == '\0')
      return NDN_TRUST_SCHEMA_PATTERN_STRING_PREMATURE_TERMINATION;
  }

  int ret_val = -1;

  pattern->components_size = 0;

  // first check if it's a rule reference
  if (string[0] != '<' && string[0] != '(' && string[0] != '['
      && string[0] != '\\') {
    ndn_trust_schema_pattern_component_t component;
    ret_val = ndn_trust_schema_pattern_component_from_string(&component, string, size);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = ndn_trust_schema_pattern_append_component(pattern, &component);
    if (ret_val != NDN_SUCCESS) return ret_val;
    return 0;
  }

  // flag to remember whether the pattern component being appended should be
  // marked as the beginning of a subpattern (SPB = Sub Pattern Beginning)
  bool should_add_SPB = false;
  // current subpattern index; will return error if more than
  // NDN_TRUST_SCHEMA_MAX_SUBPATTERN_MATCHES subpatterns are found
  uint8_t current_subpattern_capture_begin_index = 0;
  uint8_t current_subpattern_capture_end_index = 0;
  const char* current_string = string;
  uint32_t last_type = NDN_TRUST_SCHEMA_NO_TYPE;
  uint32_t current_type = NDN_TRUST_SCHEMA_NO_TYPE;
  uint8_t num_subpattern_indexes = 0;
  // iterate through the schema pattern
  while ((uint32_t)(current_string - string) < size) {
    int pattern_comp_end_index = -1;
    switch (current_string[0]) {
      case '<':
        pattern_comp_end_index = re_match("^<>\\*", current_string);
        if (pattern_comp_end_index == TINY_REGEX_C_FAIL) {
          pattern_comp_end_index = re_match(">", current_string);
          if (pattern_comp_end_index == TINY_REGEX_C_FAIL)
            return NDN_TRUST_SCHEMA_PATTERN_COMPONENT_PARSING_ERROR;
          else
            current_type = (pattern_comp_end_index == 2)
                               ? NDN_TRUST_SCHEMA_WILDCARD_NAME_COMPONENT
                               : NDN_TRUST_SCHEMA_SINGLE_NAME_COMPONENT;
        } else {
          current_type = NDN_TRUST_SCHEMA_WILDCARD_NAME_COMPONENT_SEQUENCE;
          pattern_comp_end_index += 2;
        }
        break;
      case '[':
        pattern_comp_end_index = re_match("]", current_string);
        if (pattern_comp_end_index == TINY_REGEX_C_FAIL)
          return NDN_TRUST_SCHEMA_PATTERN_COMPONENT_PARSING_ERROR;
        else
          current_type = NDN_TRUST_SCHEMA_WILDCARD_SPECIALIZER;
        break;
      case '\\':
        pattern_comp_end_index = re_match("[0-9]", current_string);
        if (pattern_comp_end_index == TINY_REGEX_C_FAIL)
          return NDN_TRUST_SCHEMA_PATTERN_COMPONENT_PARSING_ERROR;
        else
          current_type = NDN_TRUST_SCHEMA_SUBPATTERN_INDEX;
        num_subpattern_indexes++;
        break;
      case '(':
        // make sure that there is a corresponding end parentheses for this
        // subpattern
        pattern_comp_end_index = re_match(")", current_string);
        if (pattern_comp_end_index == TINY_REGEX_C_FAIL)
          return NDN_TRUST_SCHEMA_PATTERN_COMPONENT_PARSING_ERROR;
        should_add_SPB = true;
        current_string += 1;
        continue;
      case ')':
        // set the last pattern component's subpattern info to indicate that it
        // was the ending of a subpattern
        pattern->components[pattern->components_size - 1].subpattern_info |=
            (NDN_TRUST_SCHEMA_SUBPATTERN_END_ONLY << 6) |
            (current_subpattern_capture_end_index);
        current_subpattern_capture_end_index++;
        current_string += 1;
        continue;
      default:
        if (current_string[0] == '\0')
          break;
        else
          return NDN_TRUST_SCHEMA_PATTERN_COMPONENT_PARSING_ERROR;
    }

    // do not allow more than one consecutive wildcard name component sequences
    if (current_type == NDN_TRUST_SCHEMA_WILDCARD_NAME_COMPONENT_SEQUENCE
        && last_type == NDN_TRUST_SCHEMA_WILDCARD_NAME_COMPONENT_SEQUENCE)
      return NDN_TRUST_SCHEMA_PATTERN_INVALID_FORMAT;
    last_type = current_type;

    int pattern_comp_string_len = pattern_comp_end_index + 1;

    ndn_trust_schema_pattern_component_t component;
    component.subpattern_info = 0;
    ret_val = ndn_trust_schema_pattern_component_from_string(
        &component, current_string, pattern_comp_string_len);
    if (ret_val != NDN_SUCCESS) return ret_val;

    if (should_add_SPB) {
      // set the current pattern component's subpattern info to indicate that it
      // was the beginning of a subpattern
      component.subpattern_info |=
          (NDN_TRUST_SCHEMA_SUBPATTERN_BEGIN_ONLY << 6) |
          (current_subpattern_capture_begin_index);
      current_subpattern_capture_begin_index++;
      if (current_subpattern_capture_begin_index + 1 >
          NDN_TRUST_SCHEMA_MAX_SUBPATTERN_MATCHES) {
        return NDN_TRUST_SCHEMA_NUMBER_OF_SUBPATTERNS_EXCEEDS_LIMIT;
      }
      should_add_SPB = false;
    }

    ret_val = ndn_trust_schema_pattern_append_component(pattern, &component);
    if (ret_val != NDN_SUCCESS) return ret_val;

    current_string += pattern_comp_end_index + 1;
  }

  if (current_subpattern_capture_begin_index !=
      current_subpattern_capture_end_index) {
    return NDN_TRUST_SCHEMA_PATTERN_COMPONENT_PARSING_ERROR;
  }

  pattern->num_subpattern_captures = current_subpattern_capture_begin_index;
  pattern->num_subpattern_indexes = num_subpattern_indexes;

  return 0;
}